

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float16 float64_to_float16_riscv64(float64 a,_Bool ieee,float_status *s)

{
  undefined7 in_register_00000031;
  FloatFmt *dstf;
  FloatParts FVar1;
  
  dstf = &float16_params_ahp;
  if ((int)CONCAT71(in_register_00000031,ieee) != 0) {
    dstf = &float16_params;
  }
  FVar1._8_8_ = (ulong)((uint)(a >> 0x34) & 0x7ff) | a >> 0x17 & 0x10000000000;
  FVar1.frac = a & 0xfffffffffffff;
  FVar1 = sf_canonicalize(FVar1,&float64_params,s);
  FVar1 = float_to_float(FVar1,dstf,s);
  FVar1 = round_canonical(FVar1,s,dstf);
  return (ushort)FVar1.frac & 0x3ff | (ushort)((FVar1.exp & 0x1fU) << 10) |
         (ushort)(FVar1._8_8_ >> 0x19) & 0x8000;
}

Assistant:

float16 float64_to_float16(float64 a, bool ieee, float_status *s)
{
    const FloatFmt *fmt16 = ieee ? &float16_params : &float16_params_ahp;
    FloatParts p = float64_unpack_canonical(a, s);
    FloatParts pr = float_to_float(p, fmt16, s);
    return float16a_round_pack_canonical(pr, s, fmt16);
}